

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O3

void __thiscall
google::protobuf::internal::ThreadSafeArena::InitializeFrom
          (ThreadSafeArena *this,void *mem,size_t size)

{
  size_t sVar1;
  LogMessage *pLVar2;
  SerialArena *pSVar3;
  undefined8 in_RCX;
  size_t *in_FS_OFFSET;
  Memory mem_00;
  LogFinisher local_59;
  LogMessage local_58;
  
  if (((ulong)mem & 7) != 0) {
    in_RCX = 0;
    LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/arena.cc"
               ,0xda);
    pLVar2 = LogMessage::operator<<
                       (&local_58,"CHECK failed: (reinterpret_cast<uintptr_t>(mem) & 7) == (0u): ");
    LogFinisher::operator=(&local_59,pLVar2);
    LogMessage::~LogMessage(&local_58);
  }
  if (7 < *(ulong *)(this + 8)) {
    in_RCX = 0;
    LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/arena.cc"
               ,0xdb);
    pLVar2 = LogMessage::operator<<(&local_58,"CHECK failed: !AllocPolicy(): ");
    LogFinisher::operator=(&local_59,pLVar2);
    LogMessage::~LogMessage(&local_58);
  }
  Init(this);
  if (size >= 0x50 && mem != (void *)0x0) {
    this[8] = (ThreadSafeArena)((byte)this[8] | 1);
    sVar1 = *in_FS_OFFSET;
    mem_00.size = sVar1;
    mem_00.ptr = (void *)size;
    pSVar3 = SerialArena::New((SerialArena *)mem,mem_00,
                              (void *)CONCAT71((int7)((ulong)in_RCX >> 8),
                                               size < 0x50 || mem == (void *)0x0));
    pSVar3->next_ = (SerialArena *)0x0;
    *(SerialArena **)(this + 0x10) = pSVar3;
    *(SerialArena **)(sVar1 + 0x10) = pSVar3;
    *(undefined8 *)(sVar1 + 8) = *(undefined8 *)this;
    *(SerialArena **)(this + 0x18) = pSVar3;
  }
  return;
}

Assistant:

void ThreadSafeArena::InitializeFrom(void* mem, size_t size) {
  GOOGLE_DCHECK_EQ(reinterpret_cast<uintptr_t>(mem) & 7, 0u);
  GOOGLE_DCHECK(!AllocPolicy());  // Reset should call InitializeWithPolicy instead.
  Init();

  // Ignore initial block if it is too small.
  if (mem != nullptr && size >= kBlockHeaderSize + kSerialArenaSize) {
    alloc_policy_.set_is_user_owned_initial_block(true);
    SetInitialBlock(mem, size);
  }
}